

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  ulong uVar1;
  int iVar2;
  uint p2;
  uint uVar3;
  uint p2_00;
  int p3;
  Index *pIVar4;
  char *zArg1;
  char *pcVar5;
  int reg3;
  int reg2;
  int reg1;
  int fileFormat;
  int addr1;
  char *zDb_1;
  char *zDb;
  Token *pName;
  Vdbe *pVStack_50;
  int iDb;
  Vdbe *v;
  sqlite3 *db;
  char *zName;
  Table *pTable;
  int local_28;
  int isVirtual_local;
  int isView_local;
  int isTemp_local;
  Token *pName2_local;
  Token *pName1_local;
  Parse *pParse_local;
  
  db = (sqlite3 *)0x0;
  v = (Vdbe *)pParse->db;
  pTable._4_4_ = isVirtual;
  local_28 = isView;
  isVirtual_local = isTemp;
  _isView_local = pName2;
  pName2_local = pName1;
  pName1_local = (Token *)pParse;
  if (((((sqlite3 *)v)->init).busy == '\0') || ((((sqlite3 *)v)->init).newTnum != 1)) {
    pName._4_4_ = sqlite3TwoPartName(pParse,pName1,pName2,(Token **)&zDb);
    if ((int)pName._4_4_ < 0) {
      return;
    }
    if (((isVirtual_local != 0) && (_isView_local->n != 0)) && (pName._4_4_ != 1)) {
      sqlite3ErrorMsg((Parse *)pName1_local,"temporary table name must be unqualified");
      return;
    }
    if (isVirtual_local != 0) {
      pName._4_4_ = 1;
    }
    db = (sqlite3 *)sqlite3NameFromToken((sqlite3 *)v,(Token *)zDb);
    if (1 < *(byte *)((long)&pName1_local[0x11].z + 4)) {
      sqlite3RenameTokenMap((Parse *)pName1_local,db,(Token *)zDb);
    }
  }
  else {
    pName._4_4_ = (uint)(((sqlite3 *)v)->init).iDb;
    pcVar5 = "sqlite_master";
    if (pName._4_4_ == 1) {
      pcVar5 = "sqlite_temp_master";
    }
    db = (sqlite3 *)sqlite3DbStrDup((sqlite3 *)v,pcVar5);
    zDb = (char *)pName2_local;
  }
  pName1_local[0xf].z = *(char **)zDb;
  *(undefined8 *)&pName1_local[0xf].n = *(undefined8 *)(zDb + 8);
  if (db == (sqlite3 *)0x0) {
    return;
  }
  iVar2 = sqlite3CheckObjectName((Parse *)pName1_local,(char *)db);
  if (iVar2 == 0) {
    if (*(char *)((long)&v->pVList + 4) == '\x01') {
      isVirtual_local = 1;
    }
    pcVar5 = *(char **)(*(long *)&v->nVar + (long)(int)pName._4_4_ * 0x20);
    zArg1 = "sqlite_master";
    if (isVirtual_local == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar2 = sqlite3AuthCheck((Parse *)pName1_local,0x12,zArg1,(char *)0x0,pcVar5);
    if ((iVar2 == 0) &&
       ((pTable._4_4_ != 0 ||
        (iVar2 = sqlite3AuthCheck((Parse *)pName1_local,
                                  (uint)"\x02\x04\b\x06"[isVirtual_local + local_28 * 2],(char *)db,
                                  (char *)0x0,pcVar5), iVar2 == 0)))) {
      if (*(char *)((long)&pName1_local[0x11].z + 4) == '\0') {
        pcVar5 = *(char **)(*(long *)&v->nVar + (long)(int)pName._4_4_ * 0x20);
        iVar2 = sqlite3ReadSchema((Parse *)pName1_local);
        if (iVar2 != 0) goto LAB_001a4ccb;
        zName = (char *)sqlite3FindTable((sqlite3 *)v,(char *)db,pcVar5);
        if ((Table *)zName != (Table *)0x0) {
          if (noErr == 0) {
            sqlite3ErrorMsg((Parse *)pName1_local,"table %T already exists",zDb);
          }
          else {
            sqlite3CodeVerifySchema((Parse *)pName1_local,pName._4_4_);
          }
          goto LAB_001a4ccb;
        }
        pIVar4 = sqlite3FindIndex((sqlite3 *)v,(char *)db,pcVar5);
        if (pIVar4 != (Index *)0x0) {
          sqlite3ErrorMsg((Parse *)pName1_local,"there is already an index named %s",db);
          goto LAB_001a4ccb;
        }
      }
      zName = (char *)sqlite3DbMallocZero((sqlite3 *)v,0x80);
      if (zName != (char *)0x0) {
        *(sqlite3 **)zName = db;
        zName[0x44] = -1;
        zName[0x45] = -1;
        *(undefined8 *)(zName + 0x70) =
             *(undefined8 *)(*(long *)&v->nVar + (long)(int)pName._4_4_ * 0x20 + 0x18);
        zName[0x3c] = '\x01';
        zName[0x3d] = '\0';
        zName[0x3e] = '\0';
        zName[0x3f] = '\0';
        zName[0x48] = -0x38;
        zName[0x49] = '\0';
        pName1_local[0x14].z = zName;
        if ((pName1_local[1].field_0xe == '\0') &&
           (iVar2 = strcmp((char *)db,"sqlite_sequence"), iVar2 == 0)) {
          *(char **)(*(long *)(zName + 0x70) + 0x68) = zName;
        }
        if (*(char *)((long)&v->pVList + 5) != '\0') {
          return;
        }
        pVStack_50 = sqlite3GetVdbe((Parse *)pName1_local);
        if (pVStack_50 == (Vdbe *)0x0) {
          return;
        }
        sqlite3BeginWriteOperation((Parse *)pName1_local,1,pName._4_4_);
        if (pTable._4_4_ != 0) {
          sqlite3VdbeAddOp0(pVStack_50,0xa0);
        }
        p2 = pName1_local[3].n + 1;
        pName1_local[3].n = p2;
        pName1_local[7].n = p2;
        uVar3 = pName1_local[3].n + 1;
        pName1_local[3].n = uVar3;
        *(uint *)&pName1_local[7].field_0xc = uVar3;
        p2_00 = pName1_local[3].n + 1;
        pName1_local[3].n = p2_00;
        sqlite3VdbeAddOp3(pVStack_50,0x5e,pName._4_4_,p2_00,2);
        sqlite3VdbeUsesBtree(pVStack_50,pName._4_4_);
        iVar2 = sqlite3VdbeAddOp1(pVStack_50,0x12,p2_00);
        uVar1._0_4_ = v->cacheCtr;
        uVar1._4_4_ = v->pc;
        p3 = 4;
        if ((uVar1 & 2) != 0) {
          p3 = 1;
        }
        sqlite3VdbeAddOp3(pVStack_50,0x5f,pName._4_4_,2,p3);
        sqlite3VdbeAddOp3(pVStack_50,0x5f,pName._4_4_,5,(uint)*(byte *)((long)&v->nStmtDefCons + 6))
        ;
        sqlite3VdbeJumpHere(pVStack_50,iVar2);
        if ((local_28 == 0) && (pTable._4_4_ == 0)) {
          uVar3 = sqlite3VdbeAddOp3(pVStack_50,0x8b,pName._4_4_,uVar3,1);
          pName1_local[0xb].n = uVar3;
        }
        else {
          sqlite3VdbeAddOp2(pVStack_50,0x46,0,uVar3);
        }
        sqlite3OpenMasterTable((Parse *)pName1_local,pName._4_4_);
        sqlite3VdbeAddOp2(pVStack_50,0x79,0,p2);
        sqlite3VdbeAddOp4(pVStack_50,0x4b,6,p2_00,0,"\x06",-1);
        sqlite3VdbeAddOp3(pVStack_50,0x7a,0,p2_00,p2);
        sqlite3VdbeChangeP5(pVStack_50,8);
        sqlite3VdbeAddOp0(pVStack_50,0x75);
        return;
      }
      pName1_local[1].n = 7;
      *(int *)&pName1_local[3].z = *(int *)&pName1_local[3].z + 1;
      zName = (char *)0x0;
    }
  }
LAB_001a4ccb:
  sqlite3DbFree((sqlite3 *)v,db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  if( db->init.busy && db->init.newTnum==1 ){
    /* Special case:  Parsing the sqlite_master or sqlite_temp_master schema */
    iDb = db->init.iDb;
    zName = sqlite3DbStrDup(db, SCHEMA_TABLE(iDb));
    pName = pName1;
  }else{
    /* The common case */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) return;
    if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
      /* If creating a temp table, the name may not be qualified. Unless 
      ** the database name is "temp" anyway.  */
      sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
      return;
    }
    if( !OMIT_TEMPDB && isTemp ) iDb = 1;
    zName = sqlite3NameFromToken(db, pName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)zName, pName);
    }
  }
  pParse->sNameToken = *pName;
  if( zName==0 ) return;
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( isTemp==0 || isTemp==1 );
  assert( isView==0 || isView==1 );
  {
    static const u8 aCode[] = {
       SQLITE_CREATE_TABLE,
       SQLITE_CREATE_TEMP_TABLE,
       SQLITE_CREATE_VIEW,
       SQLITE_CREATE_TEMP_VIEW
    };
    char *zDb = db->aDb[iDb].zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, (int)aCode[isTemp+2*isView],
                                       zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_SPECIAL_PARSE ){
    char *zDb = db->aDb[iDb].zDbSName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "table %T already exists", pName);
      }else{
        assert( !db->init.busy || CORRUPT_DB );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    assert( db->mallocFailed );
    pParse->rc = SQLITE_NOMEM_BKPT;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nTabRef = 1;
#ifdef SQLITE_DEFAULT_ROWEST
  pTable->nRowLogEst = sqlite3LogEst(SQLITE_DEFAULT_ROWEST);
#else
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
#endif
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* If this is the magic sqlite_sequence table used by autoincrement,
  ** then record a pointer to this table in the main database structure
  ** so that INSERT can find the table easily.
  */
#ifndef SQLITE_OMIT_AUTOINCREMENT
  if( !pParse->nested && strcmp(zName, "sqlite_sequence")==0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTable->pSchema->pSeqTab = pTable;
  }
#endif

  /* Begin generating the code that will insert the table record into
  ** the SQLITE_MASTER table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the 
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int addr1;
    int fileFormat;
    int reg1, reg2, reg3;
    /* nullRow[] is an OP_Record encoding of a row containing 5 NULLs */
    static const char nullRow[] = { 6, 0, 0, 0, 0, 0 };
    sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set, 
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    addr1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, fileFormat);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, ENC(db));
    sqlite3VdbeJumpHere(v, addr1);

    /* This just creates a place-holder record in the sqlite_master table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      pParse->addrCrTab =
         sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, reg2, BTREE_INTKEY);
    }
    sqlite3OpenMasterTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp4(v, OP_Blob, 6, reg3, 0, nullRow, P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  sqlite3DbFree(db, zName);
  return;
}